

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Security.h
# Opt level: O2

uint Security::GetByteCount<long>(long value)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  
  uVar1 = 0;
  for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 8) {
    uVar3 = value >> ((byte)lVar2 & 0x3f);
    uVar1 = uVar1 + (((uint)uVar3 & 0xff) != 0xff && (uVar3 & 0xff) != 0);
  }
  return uVar1;
}

Assistant:

static uint GetByteCount(T value)
    {
        uint byteCount = 0;
        for (uint i = 0; i < sizeof(T); ++i)
        {
            if (IsByteSet(value, i))
            {
                ++byteCount;
            }
        }
        return byteCount;
    }